

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Render(void)

{
  ImDrawDataBuilder *out_list;
  uint uVar1;
  ImGuiWindow *window;
  ImDrawList *pIVar2;
  ImGuiContext *ctx;
  ImGuiContext *pIVar3;
  ImGuiWindow *pIVar4;
  int iVar5;
  int iVar6;
  int n;
  ulong uVar7;
  ImDrawList **ppIVar8;
  int n_1;
  long lVar9;
  ImGuiWindow *pIVar10;
  ImGuiWindow *windows_to_render_top_most [2];
  
  ctx = GImGui;
  iVar5 = GImGui->FrameCountEnded;
  if (iVar5 != GImGui->FrameCount) {
    EndFrame();
    iVar5 = ctx->FrameCount;
  }
  ctx->FrameCountRendered = iVar5;
  (ctx->IO).MetricsRenderWindows = 0;
  out_list = &ctx->DrawDataBuilder;
  ImDrawDataBuilder::Clear(out_list);
  CallContextHooks(ctx,ImGuiContextHookType_RenderPre);
  if ((ctx->BackgroundDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&ctx->BackgroundDrawList);
  }
  pIVar10 = ctx->NavWindowingTarget;
  if (pIVar10 == (ImGuiWindow *)0x0) {
    windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
    pIVar10 = (ImGuiWindow *)0x0;
  }
  else {
    if ((pIVar10->Flags & 0x2000) == 0) {
      windows_to_render_top_most[0] = pIVar10->RootWindow;
    }
    else {
      windows_to_render_top_most[0] = (ImGuiWindow *)0x0;
    }
    pIVar10 = ctx->NavWindowingListWindow;
  }
  pIVar4 = windows_to_render_top_most[0];
  windows_to_render_top_most[1] = pIVar10;
  for (uVar7 = 0; uVar7 != (uint)(ctx->Windows).Size; uVar7 = uVar7 + 1) {
    window = (ctx->Windows).Data[uVar7];
    if (((window->Active == true) && (window->Hidden == false)) &&
       ((window != pIVar10 && window != pIVar4) && (window->Flags & 0x1000000) == 0)) {
      AddRootWindowToDrawData(window);
    }
  }
  for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
    pIVar10 = windows_to_render_top_most[lVar9];
    if (((pIVar10 != (ImGuiWindow *)0x0) && (pIVar10->Active == true)) && (pIVar10->Hidden == false)
       ) {
      AddRootWindowToDrawData(pIVar10);
    }
  }
  ImDrawDataBuilder::FlattenIntoSingleLayer(out_list);
  if ((ctx->IO).MouseDrawCursor != false) {
    RenderMouseCursor(&ctx->ForegroundDrawList,(ctx->IO).MousePos,(ctx->Style).MouseCursorScale,
                      ctx->MouseCursor,0xffffffff,0xff000000,0x30000000);
  }
  if ((ctx->ForegroundDrawList).VtxBuffer.Size != 0) {
    AddDrawListToDrawData(out_list->Layers,&ctx->ForegroundDrawList);
  }
  pIVar3 = GImGui;
  (ctx->DrawData).Valid = true;
  uVar1 = (ctx->DrawDataBuilder).Layers[0].Size;
  iVar5 = 0;
  if ((int)uVar1 < 1) {
    ppIVar8 = (ImDrawList **)0x0;
  }
  else {
    ppIVar8 = (ctx->DrawDataBuilder).Layers[0].Data;
  }
  (ctx->DrawData).CmdLists = ppIVar8;
  (ctx->DrawData).CmdListsCount = uVar1;
  (ctx->DrawData).TotalIdxCount = 0;
  (ctx->DrawData).TotalVtxCount = 0;
  (ctx->DrawData).DisplayPos.x = 0.0;
  (ctx->DrawData).DisplayPos.y = 0.0;
  (ctx->DrawData).DisplaySize = (pIVar3->IO).DisplaySize;
  (ctx->DrawData).FramebufferScale = (pIVar3->IO).DisplayFramebufferScale;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  iVar6 = 0;
  for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
    pIVar2 = (ctx->DrawDataBuilder).Layers[0].Data[uVar7];
    iVar6 = iVar6 + (pIVar2->VtxBuffer).Size;
    (ctx->DrawData).TotalVtxCount = iVar6;
    iVar5 = iVar5 + (pIVar2->IdxBuffer).Size;
    (ctx->DrawData).TotalIdxCount = iVar5;
  }
  (ctx->IO).MetricsRenderVertices = iVar6;
  (ctx->IO).MetricsRenderIndices = iVar5;
  CallContextHooks(ctx,ImGuiContextHookType_RenderPost);
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    if (g.FrameCountEnded != g.FrameCount)
        EndFrame();
    g.FrameCountRendered = g.FrameCount;
    g.IO.MetricsRenderWindows = 0;
    g.DrawDataBuilder.Clear();

    CallContextHooks(&g, ImGuiContextHookType_RenderPre);

    // Add background ImDrawList
    if (!g.BackgroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.BackgroundDrawList);

    // Add ImDrawList to render
    ImGuiWindow* windows_to_render_top_most[2];
    windows_to_render_top_most[0] = (g.NavWindowingTarget && !(g.NavWindowingTarget->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus)) ? g.NavWindowingTarget->RootWindow : NULL;
    windows_to_render_top_most[1] = (g.NavWindowingTarget ? g.NavWindowingListWindow : NULL);
    for (int n = 0; n != g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        if (IsWindowActiveAndVisible(window) && (window->Flags & ImGuiWindowFlags_ChildWindow) == 0 && window != windows_to_render_top_most[0] && window != windows_to_render_top_most[1])
            AddRootWindowToDrawData(window);
    }
    for (int n = 0; n < IM_ARRAYSIZE(windows_to_render_top_most); n++)
        if (windows_to_render_top_most[n] && IsWindowActiveAndVisible(windows_to_render_top_most[n])) // NavWindowingTarget is always temporarily displayed as the top-most window
            AddRootWindowToDrawData(windows_to_render_top_most[n]);
    g.DrawDataBuilder.FlattenIntoSingleLayer();

    // Draw software mouse cursor if requested
    if (g.IO.MouseDrawCursor)
        RenderMouseCursor(&g.ForegroundDrawList, g.IO.MousePos, g.Style.MouseCursorScale, g.MouseCursor, IM_COL32_WHITE, IM_COL32_BLACK, IM_COL32(0, 0, 0, 48));

    // Add foreground ImDrawList
    if (!g.ForegroundDrawList.VtxBuffer.empty())
        AddDrawListToDrawData(&g.DrawDataBuilder.Layers[0], &g.ForegroundDrawList);

    // Setup ImDrawData structure for end-user
    SetupDrawData(&g.DrawDataBuilder.Layers[0], &g.DrawData);
    g.IO.MetricsRenderVertices = g.DrawData.TotalVtxCount;
    g.IO.MetricsRenderIndices = g.DrawData.TotalIdxCount;

    CallContextHooks(&g, ImGuiContextHookType_RenderPost);
}